

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini_processing.cpp
# Opt level: O1

void __thiscall IniProcessing::setValue(IniProcessing *this,char *key,short value)

{
  uint6 in_register_00000012;
  uint __val;
  uint uVar1;
  ulong uVar2;
  string __str;
  string local_50;
  
  uVar1 = (uint)CONCAT62(in_register_00000012,value);
  __val = -uVar1;
  if (0 < (int)uVar1) {
    __val = uVar1;
  }
  uVar1 = 1;
  if (((9 < __val) && (uVar1 = 2, 99 < __val)) && (uVar1 = 3, 999 < __val)) {
    uVar1 = 5 - (__val < 10000);
  }
  uVar2 = (((ulong)in_register_00000012 & 0x8000) << 0x10) >> 0x1f;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_50,(char)uVar1 + (char)uVar2);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_50._M_dataplus._M_p + uVar2,uVar1,__val);
  writeIniParam(this,key,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void IniProcessing::setValue(const char *key, short value)
{
    writeIniParam(key, std::to_string(value));
}